

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

uint32_t mp_decode_strl(char **data)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)*data;
  bVar1 = *pbVar4;
  *data = (char *)(pbVar4 + 1);
  if (bVar1 == 0xdb) {
    uVar3 = *(uint *)(pbVar4 + 1);
    *data = (char *)(pbVar4 + 5);
    return uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
  if (bVar1 == 0xda) {
    uVar2 = *(ushort *)(pbVar4 + 1);
    *data = (char *)(pbVar4 + 3);
    return (uint32_t)(ushort)(uVar2 << 8 | uVar2 >> 8);
  }
  if (bVar1 == 0xd9) {
    bVar1 = pbVar4[1];
    *data = (char *)(pbVar4 + 2);
    return (uint32_t)bVar1;
  }
  if (0xdf < (byte)(bVar1 + 0x40)) {
    return bVar1 & 0x1f;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0xa54,"uint32_t mp_decode_strl(const char **)");
}

Assistant:

MP_IMPL uint32_t
mp_decode_strl(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xd9:
		return mp_load_u8(data);
	case 0xda:
		return mp_load_u16(data);
	case 0xdb:
		return mp_load_u32(data);
	default:
		if (mp_unlikely(c < 0xa0 || c > 0xbf))
			mp_unreachable();
		return c & 0x1f;
	}
}